

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

void Abc_DesPrint(Abc_Des_t *p)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  uint i;
  int iVar3;
  
  printf("Models of design %s:\n",p->pName);
  i = 0;
  while ((int)i < p->vModules->nSize) {
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,i);
    i = i + 1;
    printf("%2d : %20s   ",(ulong)i,pNtk->pName);
    printf("nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n",
           (ulong)(uint)pNtk->nObjCounts[7],(ulong)(uint)pNtk->nObjCounts[8],
           (ulong)(uint)pNtk->nObjCounts[9],(ulong)(uint)pNtk->nObjCounts[10]);
    if (pNtk->nObjCounts[10] != 0) {
      for (iVar3 = 0; iVar1 = pNtk->vBoxes->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,iVar3);
        if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 9) {
          printf("     %20s (whitebox)\n",*(undefined8 *)((long)(pAVar2->field_5).pData + 8));
        }
      }
      for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,iVar3);
        if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 10) {
          printf("     %20s (blackbox)\n",*(undefined8 *)((long)(pAVar2->field_5).pData + 8));
        }
        iVar1 = pNtk->vBoxes->nSize;
      }
    }
  }
  return;
}

Assistant:

void Abc_DesPrint( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj;
    int i, k;
    printf( "Models of design %s:\n", p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        printf( "%2d : %20s   ", i+1, pNtk->pName );
        printf( "nd = %6d   lat = %6d   whitebox = %3d   blackbox = %3d\n", 
            Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk), 
            Abc_NtkWhiteboxNum(pNtk), Abc_NtkBlackboxNum(pNtk) );
        if ( Abc_NtkBlackboxNum(pNtk) == 0 )
            continue;
        Abc_NtkForEachWhitebox( pNtk, pObj, k )
            printf( "     %20s (whitebox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
        Abc_NtkForEachBlackbox( pNtk, pObj, k )
            printf( "     %20s (blackbox)\n", Abc_NtkName((Abc_Ntk_t *)pObj->pData) );
    }
}